

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O3

void Kf_SetMergePairs(Kf_Set_t *p,Kf_Cut_t *pCut0,Kf_Cut_t *pCuts,int nCuts,int fArea)

{
  Kf_Cut_t *pKVar1;
  ushort uVar2;
  Kf_Cut_t *pKVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  
  if (p->nTEntries != 0) {
    __assert_fail("p->nTEntries == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaKf.c"
                  ,399,"void Kf_HashPopulate(Kf_Set_t *, Kf_Cut_t *)");
  }
  uVar7 = pCut0->nLeaves;
  uVar12 = 0;
  if (0 < (int)uVar7) {
    lVar8 = 0;
    do {
      uVar13 = pCut0->pLeaves[lVar8];
      if ((int)uVar13 < 1) {
LAB_00730b24:
        __assert_fail("i > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaKf.c"
                      ,0x179,"int Kf_HashLookup(Kf_Set_t *, int)");
      }
      uVar4 = (ulong)(p->TableMask & uVar13);
      uVar6 = p->pTable[uVar4];
      if (uVar6 == 0) {
LAB_0073083c:
        if (uVar12 != p->nLutSize) {
          p->pTable[uVar4] = uVar13;
          p->pPlace[(int)uVar12] = (int)uVar4;
          iVar14 = p->nTEntries;
          uVar12 = iVar14 + 1;
          p->nTEntries = uVar12;
          p->pValue[uVar4] = iVar14;
          uVar7 = pCut0->nLeaves;
        }
      }
      else {
        do {
          if (uVar6 == uVar13) goto LAB_0073086d;
          uVar11 = (int)uVar4 + 1U & p->TableMask;
          uVar4 = (ulong)uVar11;
          uVar6 = p->pTable[uVar4];
        } while (uVar6 != 0);
        if (uVar11 != 0xffffffff) goto LAB_0073083c;
      }
LAB_0073086d:
      lVar8 = lVar8 + 1;
    } while (lVar8 < (int)uVar7);
  }
  if (uVar12 != uVar7) {
    __assert_fail("p->nTEntries == pCut->nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaKf.c"
                  ,0x192,"void Kf_HashPopulate(Kf_Set_t *, Kf_Cut_t *)");
  }
  if (0 < nCuts) {
    pKVar3 = pCuts + nCuts;
    uVar2 = p->nLutSize;
    do {
      uVar12 = pCut0->nLeaves;
      iVar14 = pCuts->nLeaves;
      uVar7 = (uint)uVar2;
      if (((int)(iVar14 + uVar12) <= (int)(uint)uVar2) ||
         (uVar4 = pCuts->Sign | pCut0->Sign, uVar4 = uVar4 - (uVar4 >> 1 & 0x5555555555555555),
         uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333),
         (byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) <= uVar7)) {
        if ((int)uVar12 < p->nTEntries) {
          lVar8 = (long)(int)uVar12;
          do {
            p->pTable[p->pPlace[lVar8]] = 0;
            lVar8 = lVar8 + 1;
          } while (lVar8 < p->nTEntries);
          iVar14 = pCuts->nLeaves;
        }
        p->nTEntries = uVar12;
        lVar8 = 0;
        uVar13 = uVar12;
        if (0 < iVar14) {
          do {
            uVar6 = pCuts->pLeaves[lVar8];
            if ((int)uVar6 < 1) goto LAB_00730b24;
            uVar4 = (ulong)(p->TableMask & uVar6);
            uVar13 = p->pTable[uVar4];
            if (uVar13 == 0) {
LAB_0073098f:
              uVar13 = uVar7;
              if (uVar12 == uVar7) break;
              p->pTable[uVar4] = uVar6;
              p->pPlace[(int)uVar12] = (int)uVar4;
              iVar14 = p->nTEntries;
              uVar12 = iVar14 + 1;
              p->nTEntries = uVar12;
              p->pValue[uVar4] = iVar14;
              iVar14 = pCuts->nLeaves;
            }
            else {
              do {
                if (uVar13 == uVar6) goto LAB_007309bf;
                uVar11 = (int)uVar4 + 1U & p->TableMask;
                uVar4 = (ulong)uVar11;
                uVar13 = p->pTable[uVar4];
              } while (uVar13 != 0);
              if (uVar11 != 0xffffffff) goto LAB_0073098f;
            }
LAB_007309bf:
            lVar8 = lVar8 + 1;
            uVar13 = uVar12;
          } while (lVar8 < iVar14);
        }
        if (iVar14 <= (int)lVar8) {
          p->CutCount[1] = p->CutCount[1] + 1;
          uVar4 = pCuts->Sign | pCut0->Sign;
          for (uVar12 = p->pList[(int)uVar13]; -1 < (int)uVar12; uVar12 = p->pCutsR[uVar12].iNext) {
            if (p->pCutsR[uVar12].Sign == uVar4) {
              lVar8 = (long)p->pCutsR[uVar12].nLeaves;
              if (lVar8 < 1) goto LAB_00730adb;
              lVar9 = 0;
              while( true ) {
                uVar7 = p->pCutsR[uVar12].pLeaves[lVar9];
                if ((int)uVar7 < 1) goto LAB_00730b24;
                uVar5 = (ulong)(p->TableMask & uVar7);
                uVar6 = p->pTable[uVar5];
                if (uVar6 == 0) break;
                do {
                  if (uVar6 == uVar7) goto LAB_00730a4e;
                  uVar11 = (int)uVar5 + 1U & p->TableMask;
                  uVar5 = (ulong)uVar11;
                  uVar6 = p->pTable[uVar5];
                } while (uVar6 != 0);
                if (-1 < (int)uVar11) break;
LAB_00730a4e:
                lVar9 = lVar9 + 1;
                if (lVar9 == lVar8) goto LAB_00730adb;
              }
            }
          }
          iVar14 = p->nCuts;
          p->nCuts = iVar14 + 1;
          pKVar1 = p->pCutsR + iVar14;
          p->pCutsR[iVar14].nLeaves = uVar13;
          if (0 < (int)uVar13) {
            lVar8 = 0;
            do {
              pKVar1->pLeaves[lVar8] = p->pTable[p->pPlace[lVar8]];
              lVar8 = lVar8 + 1;
            } while (lVar8 < p->nTEntries);
          }
          pKVar1->Sign = uVar4;
          iVar10 = pCuts->Delay;
          if (pCuts->Delay < pCut0->Delay) {
            iVar10 = pCut0->Delay;
          }
          pKVar1->Delay = iVar10;
          pKVar1->Area = pCut0->Area + pCuts->Area;
          pKVar1->iNext = p->pList[(int)uVar13];
          p->pList[(int)uVar13] = iVar14;
        }
      }
LAB_00730adb:
      pCuts = pCuts + 1;
    } while (pCuts < pKVar3);
    uVar12 = p->nTEntries;
  }
  if (0 < (int)uVar12) {
    lVar8 = 0;
    do {
      p->pTable[p->pPlace[lVar8]] = 0;
      lVar8 = lVar8 + 1;
    } while (lVar8 < p->nTEntries);
  }
  p->nTEntries = 0;
  return;
}

Assistant:

static inline void Kf_SetMergePairs( Kf_Set_t * p, Kf_Cut_t * pCut0, Kf_Cut_t * pCuts, int nCuts, int fArea )
{
    Kf_Cut_t * pCut1, * pCutR;  int i;
    Kf_HashPopulate( p, pCut0 );
    for ( pCut1 = pCuts; pCut1 < pCuts + nCuts; pCut1++ )
    {
        if ( pCut0->nLeaves + pCut1->nLeaves > p->nLutSize && Kf_SetCountBits(pCut0->Sign | pCut1->Sign) > p->nLutSize )
            continue;
        Kf_HashCleanup( p, pCut0->nLeaves );
        for ( i = 0; i < pCut1->nLeaves; i++ )
            if ( Kf_HashFindOrAdd(p, pCut1->pLeaves[i]) )
                break;
        if ( i < pCut1->nLeaves )
            continue;
        p->CutCount[1]++;        
        if ( Kf_SetRemoveDuplicates(p, p->nTEntries, pCut0->Sign | pCut1->Sign) )
            continue;
        // create new cut
        pCutR = p->pCutsR + p->nCuts++;
        pCutR->nLeaves = p->nTEntries;
        for ( i = 0; i < p->nTEntries; i++ )
            pCutR->pLeaves[i] = p->pTable[p->pPlace[i]];
        pCutR->Sign  = pCut0->Sign | pCut1->Sign;
        pCutR->Delay = Abc_MaxInt(pCut0->Delay, pCut1->Delay);
        pCutR->Area  = pCut0->Area + pCut1->Area;
        // add new cut
        Kf_SetAddToList( p, pCutR, 0 );
    }
    Kf_HashCleanup( p, 0 );
}